

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void __thiscall
duckdb::UpdateSegment::InitializeUpdateInfo
          (UpdateSegment *this,UpdateInfo *info,row_t *ids,SelectionVector *sel,idx_t count,
          idx_t vector_index,idx_t vector_offset)

{
  uint uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  idx_t i;
  ulong uVar4;
  
  info->segment = this;
  info->vector_index = vector_index;
  (info->prev).entry = (UndoBufferEntry *)0x0;
  (info->prev).position = 0;
  (info->next).entry = (UndoBufferEntry *)0x0;
  (info->next).position = 0;
  info->N = (sel_t)count;
  for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
    uVar2 = uVar4;
    if (sel->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)sel->sel_vector[uVar4];
    }
    uVar3 = NumericCastImpl<unsigned_long,_long,_false>::Convert(ids[uVar2]);
    uVar1 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(uVar3 - vector_offset);
    *(uint *)((long)&info[1].segment + uVar4 * 4) = uVar1;
  }
  return;
}

Assistant:

void UpdateSegment::InitializeUpdateInfo(UpdateInfo &info, row_t *ids, const SelectionVector &sel, idx_t count,
                                         idx_t vector_index, idx_t vector_offset) {
	info.segment = this;
	info.vector_index = vector_index;
	info.prev = UndoBufferPointer();
	info.next = UndoBufferPointer();

	// set up the tuple ids
	info.N = UnsafeNumericCast<sel_t>(count);
	auto tuples = info.GetTuples();
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto id = ids[idx];
		D_ASSERT(idx_t(id) >= vector_offset && idx_t(id) < vector_offset + STANDARD_VECTOR_SIZE);
		tuples[i] = NumericCast<sel_t>(NumericCast<idx_t>(id) - vector_offset);
	};
}